

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmSetPropertyCommand::HandleDirectoryMode(cmSetPropertyCommand *this)

{
  ulong uVar1;
  bool bVar2;
  cmGlobalGenerator *this_00;
  cmLocalGenerator *pcVar3;
  char *pcVar4;
  cmMakefile *this_01;
  pointer value;
  string dir;
  allocator local_59;
  string local_58;
  string local_38;
  
  uVar1 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar1 < 2) {
    this_01 = (this->super_cmCommand).Makefile;
    if (uVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&local_58,
                 (string *)((this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1))
      ;
      bVar2 = cmsys::SystemTools::FileIsFullPath(local_58._M_dataplus._M_p);
      if (!bVar2) {
        cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::assign((char *)&local_58);
        std::__cxx11::string::append((char *)&local_58);
        std::__cxx11::string::append((string *)&local_58);
      }
      cmsys::SystemTools::CollapseFullPath(&local_38,&local_58);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      pcVar3 = cmGlobalGenerator::FindLocalGenerator(this_00,&local_58);
      if (pcVar3 == (cmLocalGenerator *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_38,
                   "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                   ,&local_59);
        cmCommand::SetError(&this->super_cmCommand,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
      }
      else {
        this_01 = pcVar3->Makefile;
      }
      std::__cxx11::string::~string((string *)&local_58);
      if (pcVar3 == (cmLocalGenerator *)0x0) goto LAB_003cc4d9;
    }
    if (this->Remove == false) {
      value = (this->PropertyValue)._M_dataplus._M_p;
    }
    else {
      value = (char *)0x0;
    }
    pcVar4 = (this->PropertyName)._M_dataplus._M_p;
    if (this->AppendMode == true) {
      std::__cxx11::string::string((string *)&local_58,pcVar4,(allocator *)&local_38);
      pcVar4 = "";
      if (value != (char *)0x0) {
        pcVar4 = value;
      }
      cmMakefile::AppendProperty(this_01,&local_58,pcVar4,this->AppendAsString);
    }
    else {
      std::__cxx11::string::string((string *)&local_58,pcVar4,(allocator *)&local_38);
      cmMakefile::SetProperty(this_01,&local_58,value);
    }
    std::__cxx11::string::~string((string *)&local_58);
    bVar2 = true;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_58,"allows at most one name for DIRECTORY scope.",
               (allocator *)&local_38);
    cmCommand::SetError(&this->super_cmCommand,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
LAB_003cc4d9:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmSetPropertyCommand::HandleDirectoryMode()
{
  if(this->Names.size() > 1)
    {
    this->SetError("allows at most one name for DIRECTORY scope.");
    return false;
    }

  // Default to the current directory.
  cmMakefile* mf = this->Makefile;

  // Lookup the directory if given.
  if(!this->Names.empty())
    {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = *this->Names.begin();
    if(!cmSystemTools::FileIsFullPath(dir.c_str()))
      {
      dir = this->Makefile->GetCurrentSourceDirectory();
      dir += "/";
      dir += *this->Names.begin();
      }

    // The local generators are associated with collapsed paths.
    dir = cmSystemTools::CollapseFullPath(dir);

    // Lookup the generator.
    if(cmLocalGenerator* lg =
       this->Makefile->GetGlobalGenerator()->FindLocalGenerator(dir))
      {
      // Use the makefile for the directory found.
      mf = lg->GetMakefile();
      }
    else
      {
      // Could not find the directory.
      this->SetError
        ("DIRECTORY scope provided but requested directory was not found. "
         "This could be because the directory argument was invalid or, "
         "it is valid but has not been processed yet.");
      return false;
      }
    }

  // Set or append the property.
  const char* name = this->PropertyName.c_str();
  const char *value = this->PropertyValue.c_str();
  if (this->Remove)
    {
    value = 0;
    }
  if(this->AppendMode)
    {
    mf->AppendProperty(name, value ? value : "", this->AppendAsString);
    }
  else
    {
    mf->SetProperty(name, value);
    }

  return true;
}